

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::string_t,long,duckdb::UnaryOperatorWrapper,duckdb::GraphemeCountOperator>
               (string_t *ldata,long *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  TemplatedValidityData<unsigned_long> *pTVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long *plVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  idx_t iVar13;
  ulong uVar14;
  undefined8 local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  idx_t local_58;
  long *local_50;
  ValidityMask *local_48;
  ulong local_40;
  idx_t local_38;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_50 = result_data;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar13 = 0;
      do {
        local_68 = *(element_type **)&ldata[iVar13].value;
        p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ldata[iVar13].value.pointer.ptr
        ;
        pcVar10 = (char *)p_Stack_60;
        if ((uint)local_68 < 0xd) {
          pcVar10 = (char *)((long)&local_68 + 4);
        }
        uVar12 = (ulong)local_68 & 0xffffffff;
        if ((uint)local_68 != 0) {
          uVar11 = 0;
          do {
            if (pcVar10[uVar11] < '\0') {
              uVar12 = Utf8Proc::GraphemeCount(pcVar10,uVar12);
              result_data = local_50;
              break;
            }
            uVar11 = uVar11 + 1;
          } while (uVar12 != uVar11);
        }
        result_data[iVar13] = uVar12;
        iVar13 = iVar13 + 1;
      } while (iVar13 != count);
    }
  }
  else {
    local_58 = count;
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_38 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_68,(unsigned_long **)mask,&local_38);
      p_Var3 = p_Stack_60;
      peVar2 = local_68;
      local_68 = (element_type *)0x0;
      p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar2;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var3;
      if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
         p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
      }
      pTVar4 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar4->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
      count = local_58;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar1;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      local_40 = count + 0x3f >> 6;
      uVar11 = 0;
      local_48 = mask;
      plVar8 = local_50;
      uVar12 = 0;
      do {
        puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar9 = uVar12 + 0x40;
          if (count <= uVar12 + 0x40) {
            uVar9 = count;
          }
LAB_009fe5d8:
          uVar6 = uVar12;
          if (uVar12 < uVar9) {
            do {
              local_68 = *(element_type **)&ldata[uVar12].value;
              p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           ldata[uVar12].value.pointer.ptr;
              pcVar10 = (char *)p_Stack_60;
              if ((uint)local_68 < 0xd) {
                pcVar10 = (char *)((long)&local_68 + 4);
              }
              uVar5 = (ulong)local_68 & 0xffffffff;
              if ((uint)local_68 != 0) {
                uVar6 = 0;
                do {
                  if (pcVar10[uVar6] < '\0') {
                    uVar5 = Utf8Proc::GraphemeCount(pcVar10,uVar5);
                    plVar8 = local_50;
                    break;
                  }
                  uVar6 = uVar6 + 1;
                } while (uVar5 != uVar6);
              }
              plVar8[uVar12] = uVar5;
              uVar12 = uVar12 + 1;
              uVar6 = uVar9;
            } while (uVar12 != uVar9);
          }
        }
        else {
          uVar5 = puVar1[uVar11];
          uVar9 = uVar12 + 0x40;
          if (count <= uVar12 + 0x40) {
            uVar9 = count;
          }
          count = local_58;
          uVar6 = uVar9;
          if (uVar5 != 0) {
            if (uVar5 == 0xffffffffffffffff) goto LAB_009fe5d8;
            uVar6 = uVar12;
            uVar14 = uVar12;
            mask = local_48;
            if (uVar12 < uVar9) {
              do {
                if ((uVar5 >> ((ulong)(uint)((int)uVar14 - (int)uVar12) & 0x3f) & 1) != 0) {
                  local_68 = *(element_type **)&ldata[uVar14].value;
                  p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ldata[uVar14].value.pointer.ptr;
                  pcVar10 = (char *)p_Stack_60;
                  if ((uint)local_68 < 0xd) {
                    pcVar10 = (char *)((long)&local_68 + 4);
                  }
                  uVar6 = (ulong)local_68 & 0xffffffff;
                  if ((uint)local_68 != 0) {
                    uVar7 = 0;
                    do {
                      if (pcVar10[uVar7] < '\0') {
                        uVar6 = Utf8Proc::GraphemeCount(pcVar10,uVar6);
                        plVar8 = local_50;
                        break;
                      }
                      uVar7 = uVar7 + 1;
                    } while (uVar6 != uVar7);
                  }
                  plVar8[uVar14] = uVar6;
                }
                uVar14 = uVar14 + 1;
                count = local_58;
                uVar6 = uVar9;
                mask = local_48;
              } while (uVar14 != uVar9);
            }
          }
        }
        uVar11 = uVar11 + 1;
        uVar12 = uVar6;
      } while (uVar11 != local_40);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}